

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O1

void __thiscall cppcms::impl::tcp_cache::rise(tcp_cache *this,string *trigger)

{
  pointer pcVar1;
  string data;
  tcp_operation_header h;
  string local_78;
  tcp_operation_header local_58;
  
  local_58.filler[0] = 0;
  local_58.filler[1] = 0;
  local_58.operations.fetch.current_gen = 0;
  local_58.operations.data.timeout = 0;
  local_58.operations._16_8_ = 0;
  local_58.size = (uint32_t)trigger->_M_string_length;
  local_58.opcode = 1;
  pcVar1 = (trigger->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + trigger->_M_string_length);
  local_58.operations.out_stats.keys = (int)trigger->_M_string_length;
  tcp_connector::broadcast(&this->super_tcp_connector,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void tcp_cache::rise(std::string const &trigger)
{
	tcp_operation_header h=tcp_operation_header();
	h.opcode=opcodes::rise;
	h.size=trigger.size();
	std::string data=trigger;
	h.operations.rise.trigger_len=trigger.size();
	broadcast(h,data);
}